

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_utilities.h
# Opt level: O2

type dlib::
     sum<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,2l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>
               (matrix_exp<dlib::matrix_op<dlib::op_squared<dlib::matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                *m)

{
  long lVar1;
  long lVar2;
  
  lVar1 = **(long **)m;
  lVar2 = (*(long **)m)[1];
  return lVar1 * lVar1 + lVar2 * lVar2;
}

Assistant:

const typename lazy_disable_if<is_matrix<typename EXP::type>, EXP>::type sum (
        const matrix_exp<EXP>& m
    )
    {
        typedef typename matrix_exp<EXP>::type type;

        type val = 0;
        if (is_row_major(m))
        {
            for (long r = 0; r < m.nr(); ++r)
            {
                for (long c = 0; c < m.nc(); ++c)
                {
                    val += m(r,c);
                }
            }
        }
        else
        {
            for (long c = 0; c < m.nc(); ++c)
            {
                for (long r = 0; r < m.nr(); ++r)
                {
                    val += m(r,c);
                }
            }
        }
        return val;
    }